

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

Sym __thiscall covenant::CFG::replaceTerminal(CFG *this,Sym t)

{
  Sym LHS;
  undefined1 local_68 [16];
  pointer local_58;
  iterator iStack_50;
  Sym *local_48;
  element_type *local_40;
  shared_count local_38;
  element_type *local_30;
  shared_count local_28;
  
  if ((t.x & 1U) == 0) {
    LHS = newVar(this);
    local_68._0_8_ = (this->_tfac).px;
    local_28.pi_ = (this->_tfac).pn.pi_;
    if (local_28.pi_ == (sp_counted_base *)0x0) {
      local_38.pi_ = (sp_counted_base *)0x0;
    }
    else {
      LOCK();
      (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
      UNLOCK();
      LOCK();
      (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
      UNLOCK();
      LOCK();
      (local_28.pi_)->use_count_ = (local_28.pi_)->use_count_ + 1;
      UNLOCK();
      local_38.pi_ = local_28.pi_;
    }
    local_58 = (pointer)0x0;
    iStack_50._M_current = (Sym *)0x0;
    local_48 = (Sym *)0x0;
    local_68._8_8_ = local_38.pi_;
    local_40 = (element_type *)local_68._0_8_;
    local_30 = (element_type *)local_68._0_8_;
    boost::detail::shared_count::~shared_count(&local_38);
    local_40 = (element_type *)CONCAT44(local_40._4_4_,t.x);
    if (iStack_50._M_current == local_48) {
      std::vector<covenant::Sym,std::allocator<covenant::Sym>>::
      _M_realloc_insert<covenant::Sym_const&>
                ((vector<covenant::Sym,std::allocator<covenant::Sym>> *)&local_58,iStack_50,
                 (Sym *)&local_40);
    }
    else {
      (iStack_50._M_current)->x = t.x;
      iStack_50._M_current = iStack_50._M_current + 1;
    }
    prod(this,LHS,(Rule *)local_68);
    if (local_58 != (pointer)0x0) {
      operator_delete(local_58);
    }
    boost::detail::shared_count::~shared_count((shared_count *)(local_68 + 8));
    boost::detail::shared_count::~shared_count(&local_28);
    t = LHS;
  }
  return (Sym)t.x;
}

Assistant:

Sym replaceTerminal (Sym t)
    {
      if (t.isVar ()) return t;

      Sym nt = newVar();
      prod (nt, Rule::E(_tfac) << t);
      return nt;
    }